

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__process_marker(stbi__jpeg *z,int m)

{
  stbi__context *s;
  stbi__huffman *psVar1;
  byte bVar2;
  stbi_uc sVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int th;
  int tc;
  int q_1;
  int n;
  int i_1;
  int sizes [16];
  stbi_uc *v;
  int i;
  int t;
  int p;
  int q;
  int L;
  int m_local;
  stbi__jpeg *z_local;
  
  if (m == 0xc4) {
    iVar6 = stbi__get16be(z->s);
    for (p = iVar6 + -2; 0 < p; p = (p + -0x11) - tc) {
      tc = 0;
      bVar2 = stbi__get8(z->s);
      uVar4 = (int)(uint)bVar2 >> 4;
      uVar5 = bVar2 & 0xf;
      if ((1 < uVar4) || (3 < uVar5)) {
        iVar6 = stbi__err("bad DHT header");
        return iVar6;
      }
      for (q_1 = 0; q_1 < 0x10; q_1 = q_1 + 1) {
        bVar2 = stbi__get8(z->s);
        (&n)[q_1] = (uint)bVar2;
        tc = (&n)[q_1] + tc;
      }
      if (uVar4 == 0) {
        iVar6 = stbi__build_huffman(z->huff_dc + (int)uVar5,&n);
        if (iVar6 == 0) {
          return 0;
        }
        psVar1 = z->huff_dc + (int)uVar5;
      }
      else {
        iVar6 = stbi__build_huffman(z->huff_ac + (int)uVar5,&n);
        if (iVar6 == 0) {
          return 0;
        }
        psVar1 = z->huff_ac + (int)uVar5;
      }
      sizes._56_8_ = psVar1->values;
      for (q_1 = 0; q_1 < tc; q_1 = q_1 + 1) {
        sVar3 = stbi__get8(z->s);
        *(stbi_uc *)(sizes._56_8_ + (long)q_1) = sVar3;
      }
      if (uVar4 != 0) {
        stbi__build_fast_ac(z->fast_ac[(int)uVar5],z->huff_ac + (int)uVar5);
      }
    }
    z_local._4_4_ = (uint)(p == 0);
  }
  else if (m == 0xdb) {
    iVar6 = stbi__get16be(z->s);
    for (p = iVar6 + -2; 0 < p; p = p + -0x41) {
      bVar2 = stbi__get8(z->s);
      uVar4 = bVar2 & 0xf;
      if ((int)(uint)bVar2 >> 4 != 0) {
        iVar6 = stbi__err("bad DQT type");
        return iVar6;
      }
      if (3 < uVar4) {
        iVar6 = stbi__err("bad DQT table");
        return iVar6;
      }
      for (v._0_4_ = 0; (int)v < 0x40; v._0_4_ = (int)v + 1) {
        sVar3 = stbi__get8(z->s);
        z->dequant[(int)uVar4][stbi__jpeg_dezigzag[(int)v]] = sVar3;
      }
    }
    z_local._4_4_ = (uint)(p == 0);
  }
  else if (m == 0xdd) {
    iVar6 = stbi__get16be(z->s);
    if (iVar6 == 4) {
      iVar6 = stbi__get16be(z->s);
      z->restart_interval = iVar6;
      z_local._4_4_ = 1;
    }
    else {
      z_local._4_4_ = stbi__err("bad DRI len");
    }
  }
  else if (m == 0xff) {
    z_local._4_4_ = stbi__err("expected marker");
  }
  else if (((m < 0xe0) || (0xef < m)) && (m != 0xfe)) {
    z_local._4_4_ = 0;
  }
  else {
    s = z->s;
    iVar6 = stbi__get16be(z->s);
    stbi__skip(s,iVar6 + -2);
    z_local._4_4_ = 1;
  }
  return z_local._4_4_;
}

Assistant:

static int stbi__process_marker(stbi__jpeg *z, int m)
{
   int L;
   switch (m) {
      case STBI__MARKER_none: // no marker found
         return stbi__err("expected marker","Corrupt JPEG");

      case 0xDD: // DRI - specify restart interval
         if (stbi__get16be(z->s) != 4) return stbi__err("bad DRI len","Corrupt JPEG");
         z->restart_interval = stbi__get16be(z->s);
         return 1;

      case 0xDB: // DQT - define quantization table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            int q = stbi__get8(z->s);
            int p = q >> 4;
            int t = q & 15,i;
            if (p != 0) return stbi__err("bad DQT type","Corrupt JPEG");
            if (t > 3) return stbi__err("bad DQT table","Corrupt JPEG");
            for (i=0; i < 64; ++i)
               z->dequant[t][stbi__jpeg_dezigzag[i]] = stbi__get8(z->s);
            L -= 65;
         }
         return L==0;

      case 0xC4: // DHT - define huffman table
         L = stbi__get16be(z->s)-2;
         while (L > 0) {
            stbi_uc *v;
            int sizes[16],i,n=0;
            int q = stbi__get8(z->s);
            int tc = q >> 4;
            int th = q & 15;
            if (tc > 1 || th > 3) return stbi__err("bad DHT header","Corrupt JPEG");
            for (i=0; i < 16; ++i) {
               sizes[i] = stbi__get8(z->s);
               n += sizes[i];
            }
            L -= 17;
            if (tc == 0) {
               if (!stbi__build_huffman(z->huff_dc+th, sizes)) return 0;
               v = z->huff_dc[th].values;
            } else {
               if (!stbi__build_huffman(z->huff_ac+th, sizes)) return 0;
               v = z->huff_ac[th].values;
            }
            for (i=0; i < n; ++i)
               v[i] = stbi__get8(z->s);
            if (tc != 0)
               stbi__build_fast_ac(z->fast_ac[th], z->huff_ac + th);
            L -= n;
         }
         return L==0;
   }
   // check for comment block or APP blocks
   if ((m >= 0xE0 && m <= 0xEF) || m == 0xFE) {
      stbi__skip(z->s, stbi__get16be(z->s)-2);
      return 1;
   }
   return 0;
}